

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcdgen.h
# Opt level: O0

string * __thiscall
VcdGen::encode_signal_name_abi_cxx11_(string *__return_storage_ptr__,VcdGen *this,uint32_t index)

{
  initializer_list<char> __l;
  reference pvVar1;
  int digit;
  allocator_type local_4b;
  char local_4a [10];
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<char,_std::allocator<char>_> symbols_;
  uint32_t index_local;
  string *ret_val;
  
  symbols_.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = SUB84(this,0);
  builtin_strncpy(local_4a,"!@#$%^&*()",10);
  local_40 = local_4a;
  local_38 = 10;
  std::allocator<char>::allocator();
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_30,__l,&local_4b);
  std::allocator<char>::~allocator(&local_4b);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (symbols_.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ == 0) {
    pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_30,0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,*pvVar1);
  }
  else {
    for (; symbols_.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ != 0;
        symbols_.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ =
             (uint)symbols_.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ / 10) {
      pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_30,
                          (long)(int)((uint)symbols_.super__Vector_base<char,_std::allocator<char>_>
                                            ._M_impl._20_4_ % 10));
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pvVar1);
    }
  }
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_30)
  ;
  return __return_storage_ptr__;
}

Assistant:

string encode_signal_name(uint32_t index){
    vector<char> symbols_ = {'!', '@', '#', '$', '%', '^', '&', '*', '(', ')'};
    string ret_val;
    if( index == 0 ){
        ret_val = symbols_[0];
    } else {
        while( index > 0 ){
            int digit = index % 10;
            ret_val += symbols_[digit];
            index /= 10;
        }
    }
    return ret_val;
}